

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O3

int Fraig_TableRehashF0(Fraig_Man_t *pMan,int fLinkEquiv)

{
  Fraig_Node_t **ppFVar1;
  uint uVar2;
  Fraig_HashTable_t *pFVar3;
  Fraig_Node_t **ppFVar4;
  Fraig_Node_t *pFVar5;
  Fraig_Node_t *pFVar6;
  ulong uVar7;
  Fraig_Node_t **ppFVar8;
  int iVar9;
  long lVar10;
  Fraig_Node_t *pFVar11;
  Fraig_Node_t *pFVar12;
  long lVar13;
  Fraig_Node_t *pFVar14;
  int iVar15;
  
  pFVar3 = pMan->pTableF0;
  uVar2 = pFVar3->nBins;
  lVar13 = (long)(int)uVar2;
  ppFVar8 = (Fraig_Node_t **)calloc(1,lVar13 * 8);
  if (lVar13 < 1) {
    iVar15 = 0;
    iVar9 = 0;
  }
  else {
    ppFVar4 = pFVar3->pBins;
    lVar10 = 0;
    iVar9 = 0;
    iVar15 = 0;
    do {
      pFVar11 = ppFVar4[lVar10];
      while (pFVar11 != (Fraig_Node_t *)0x0) {
        pFVar5 = pFVar11->pNextF;
        pFVar12 = pFVar11;
        do {
          uVar7 = (ulong)pFVar12->uHashD % (ulong)uVar2;
          pFVar6 = pFVar12->pNextD;
          pFVar11 = ppFVar8[uVar7];
          if (fLinkEquiv != 0) {
            pFVar14 = pFVar11;
            if (pFVar11 == (Fraig_Node_t *)0x0) {
              pFVar11 = (Fraig_Node_t *)0x0;
            }
            else {
              do {
                if (pFVar12->uHashD == pFVar14->uHashD) {
                  pFVar12->pNextD = pFVar14->pNextD;
                  pFVar14->pNextD = pFVar12;
                  iVar15 = 1;
                  goto LAB_0068f1c0;
                }
                ppFVar1 = &pFVar14->pNextF;
                pFVar14 = *ppFVar1;
              } while (*ppFVar1 != (Fraig_Node_t *)0x0);
            }
          }
          pFVar12->pNextF = pFVar11;
          ppFVar8[uVar7] = pFVar12;
          pFVar12->pNextD = (Fraig_Node_t *)0x0;
LAB_0068f1c0:
          iVar9 = iVar9 + 1;
          pFVar11 = pFVar5;
          pFVar12 = pFVar6;
        } while (pFVar6 != (Fraig_Node_t *)0x0);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar13);
  }
  if (iVar9 != pFVar3->nEntries) {
    __assert_fail("Counter == pT->nEntries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigTable.c"
                  ,0x28b,"int Fraig_TableRehashF0(Fraig_Man_t *, int)");
  }
  if (pFVar3->pBins != (Fraig_Node_t **)0x0) {
    free(pFVar3->pBins);
  }
  pFVar3->pBins = ppFVar8;
  return iVar15;
}

Assistant:

int Fraig_TableRehashF0( Fraig_Man_t * pMan, int fLinkEquiv )
{
    Fraig_HashTable_t * pT = pMan->pTableF0;
    Fraig_Node_t ** pBinsNew;
    Fraig_Node_t * pEntF, * pEntF2, * pEnt, * pEntD2, * pEntN;
    int ReturnValue, Counter, i;
    unsigned Key;

    // allocate a new array of bins
    pBinsNew = ABC_ALLOC( Fraig_Node_t *, pT->nBins );
    memset( pBinsNew, 0, sizeof(Fraig_Node_t *) * pT->nBins );

    // rehash the entries in the table
    // go through all the nodes in the F-lists (and possible in D-lists, if used)
    Counter = 0;
    ReturnValue = 0;
    for ( i = 0; i < pT->nBins; i++ )
        Fraig_TableBinForEachEntrySafeF( pT->pBins[i], pEntF, pEntF2 )
        Fraig_TableBinForEachEntrySafeD( pEntF, pEnt, pEntD2 )
        {
            // decide where to put entry pEnt
            Key = pEnt->uHashD % pT->nBins;
            if ( fLinkEquiv )
            {
                // go through the entries in the new bin
                Fraig_TableBinForEachEntryF( pBinsNew[Key], pEntN )
                {
                    // if they have different values skip
                    if ( pEnt->uHashD != pEntN->uHashD )
                        continue;
                    // they have the same hash value, add pEnt to the D-list pEnt3
                    pEnt->pNextD  = pEntN->pNextD;
                    pEntN->pNextD = pEnt;
                    ReturnValue = 1;
                    Counter++;
                    break;
                }
                if ( pEntN != NULL ) // already linked
                    continue;
                // we did not find equal entry
            }
            // link the new entry
            pEnt->pNextF  = pBinsNew[Key];
            pBinsNew[Key] = pEnt;
            pEnt->pNextD  = NULL;
            Counter++;
        }
    assert( Counter == pT->nEntries );
    // replace the table and the parameters
    ABC_FREE( pT->pBins );
    pT->pBins = pBinsNew;
    return ReturnValue;
}